

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternFromRoot(xmlPatternPtr comp)

{
  int iVar1;
  
  iVar1 = -1;
  if (comp != (xmlPatternPtr)0x0) {
    do {
      if (comp->stream == (xmlStreamCompPtr)0x0) {
        return -1;
      }
      if ((comp->flags & 0x100) != 0) {
        return 1;
      }
      comp = comp->next;
    } while (comp != (_xmlPattern *)0x0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlPatternFromRoot(xmlPatternPtr comp) {
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	if (comp->flags & PAT_FROM_ROOT)
	    return(1);
	comp = comp->next;
    }
    return(0);

}